

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl.cpp
# Opt level: O2

void __thiscall pg::DTLSolver::run(DTLSolver *this)

{
  bitset *this_00;
  uint64_t *puVar1;
  pointer ppiVar2;
  vector<int,_std::allocator<int>_> *pvVar3;
  pointer piVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  ulong uVar9;
  ulong *puVar10;
  int *piVar11;
  uint *puVar12;
  uint *puVar13;
  ostream *poVar14;
  Error *this_01;
  int v;
  ulong uVar15;
  int iVar16;
  Game *pGVar17;
  uint64_t uVar18;
  long lVar19;
  int **x;
  pointer ppiVar20;
  int iVar21;
  ulong uVar22;
  
  uVar15 = ((this->super_Solver).game)->n_vertices;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar15;
  uVar9 = SUB168(auVar5 * ZEXT816(0x18),0);
  uVar6 = 0xffffffffffffffff;
  uVar22 = uVar9 + 8;
  if (0xfffffffffffffff7 < uVar9) {
    uVar22 = uVar6;
  }
  if (SUB168(auVar5 * ZEXT816(0x18),8) != 0) {
    uVar22 = uVar6;
  }
  puVar10 = (ulong *)operator_new__(uVar22);
  *puVar10 = uVar15;
  if (uVar15 != 0) {
    memset((vector<int,_std::allocator<int>_> *)(puVar10 + 1),0,
           ((uVar9 - 0x18) - (uVar9 - 0x18) % 0x18) + 0x18);
  }
  this->tin = (vector<int,_std::allocator<int>_> *)(puVar10 + 1);
  uVar22 = -(ulong)(uVar15 >> 0x3e != 0) | uVar15 << 2;
  piVar11 = (int *)operator_new__(uVar22);
  this->str = piVar11;
  piVar11 = (int *)operator_new__(uVar22);
  this->dvalue = piVar11;
  bitset::resize(&this->Z,uVar15);
  bitset::resize(&this->S,((this->super_Solver).game)->n_vertices);
  bitset::resize(&this->W,((this->super_Solver).game)->n_vertices);
  this_00 = &this->G;
  bitset::operator=(this_00,(this->super_Solver).disabled);
  bitset::flip(this_00);
  pGVar17 = (this->super_Solver).game;
  uVar15 = pGVar17->n_vertices;
  piVar11 = (int *)operator_new__(-(ulong)(uVar15 >> 0x3e != 0) | uVar15 << 2);
  this->Candidates = piVar11;
  bitset::resize(&this->Player,pGVar17->n_vertices);
  pGVar17 = (this->super_Solver).game;
  puVar1 = (this->Player)._bits;
  for (uVar15 = 0; uVar22 = pGVar17->n_vertices, (long)uVar15 < (long)uVar22; uVar15 = uVar15 + 1) {
    uVar22 = uVar15 >> 6;
    uVar9 = 1L << (uVar15 & 0x3f);
    if ((*(byte *)(pGVar17->_priority + uVar15) & 1) == 0) {
      uVar18 = ~uVar9 & puVar1[uVar22];
    }
    else {
      uVar18 = uVar9 | puVar1[uVar22];
    }
    puVar1[uVar22] = uVar18;
  }
  (this->Q).pointer = 0;
  puVar12 = (this->Q).queue;
  if (puVar12 != (uint *)0x0) {
    operator_delete__(puVar12);
    pGVar17 = (this->super_Solver).game;
  }
  puVar12 = (uint *)operator_new__((uVar22 & 0xffffffff) << 2);
  (this->Q).queue = puVar12;
  uVar15 = pGVar17->n_vertices;
  (this->SQ).pointer = 0;
  puVar12 = (this->SQ).queue;
  if (puVar12 != (uint *)0x0) {
    operator_delete__(puVar12);
    pGVar17 = (this->super_Solver).game;
  }
  puVar12 = (uint *)operator_new__((uVar15 & 0xffffffff) << 2);
  (this->SQ).queue = puVar12;
  uVar15 = pGVar17->n_vertices;
  (this->Zvec).pointer = 0;
  puVar12 = (this->Zvec).queue;
  if (puVar12 != (uint *)0x0) {
    operator_delete__(puVar12);
    pGVar17 = (this->super_Solver).game;
  }
  puVar12 = (uint *)operator_new__((uVar15 & 0xffffffff) << 2);
  (this->Zvec).queue = puVar12;
  uVar15 = pGVar17->n_vertices;
  (this->tangleto).pointer = 0;
  puVar12 = (this->tangleto).queue;
  if (puVar12 != (uint *)0x0) {
    operator_delete__(puVar12);
    pGVar17 = (this->super_Solver).game;
  }
  puVar12 = (uint *)operator_new__((uVar15 & 0xffffffff) << 2);
  (this->tangleto).queue = puVar12;
  bitset::resize(&this->escapes,pGVar17->n_vertices);
  pGVar17 = (this->super_Solver).game;
  puVar12 = (this->pea_vS).queue;
  uVar15 = pGVar17->n_vertices;
  (this->pea_vS).pointer = 0;
  if (puVar12 != (uint *)0x0) {
    operator_delete__(puVar12);
    pGVar17 = (this->super_Solver).game;
  }
  puVar12 = (uint *)operator_new__((uVar15 & 0xffffffff) << 2);
  (this->pea_vS).queue = puVar12;
  uVar15 = pGVar17->n_vertices;
  (this->pea_iS).pointer = 0;
  puVar12 = (this->pea_iS).queue;
  if (puVar12 != (uint *)0x0) {
    operator_delete__(puVar12);
    pGVar17 = (this->super_Solver).game;
  }
  puVar12 = (uint *)operator_new__((uVar15 & 0xffffffff) << 2);
  (this->pea_iS).queue = puVar12;
  uVar15 = pGVar17->n_vertices;
  (this->pea_S).pointer = 0;
  puVar12 = (this->pea_S).queue;
  if (puVar12 != (uint *)0x0) {
    operator_delete__(puVar12);
    pGVar17 = (this->super_Solver).game;
  }
  puVar12 = (uint *)operator_new__((uVar15 & 0xffffffff) << 2);
  (this->pea_S).queue = puVar12;
  uVar15 = pGVar17->n_vertices * 4;
  if (0x3fffffffffffffff < (ulong)pGVar17->n_vertices) {
    uVar15 = uVar6;
  }
  puVar13 = (uint *)operator_new__(uVar15);
  this->pea_vidx = puVar13;
  bitset::resize(&this->pea_root,pGVar17->n_vertices);
  if (this->interleaved == false) {
    iVar16 = 0;
    do {
      bVar7 = bitset::any(this_00);
      if (!bVar7) break;
      if ((this->super_Solver).trace != 0) {
        poVar14 = std::operator<<((this->super_Solver).logger,
                                  "\x1b[1;38;5;196miteration\x1b[m \x1b[1;36m");
        poVar14 = (ostream *)std::ostream::operator<<(poVar14,this->iterations);
        std::operator<<(poVar14,"-even\x1b[m\n");
      }
      this->iterations = this->iterations + 1;
      iVar16 = iVar16 + 1;
      bVar7 = search(this,0);
    } while (bVar7);
    iVar21 = 0;
    do {
      bVar7 = bitset::any(this_00);
      if (!bVar7) break;
      if ((this->super_Solver).trace != 0) {
        poVar14 = std::operator<<((this->super_Solver).logger,
                                  "\x1b[1;38;5;196miteration\x1b[m \x1b[1;36m");
        poVar14 = (ostream *)std::ostream::operator<<(poVar14,this->iterations);
        std::operator<<(poVar14,"-odd\x1b[m\n");
      }
      this->iterations = this->iterations + 1;
      iVar21 = iVar21 + 1;
      bVar7 = search(this,1);
    } while (bVar7);
LAB_0016dbf1:
    poVar14 = std::operator<<((this->super_Solver).logger,"found ");
    poVar14 = (ostream *)std::ostream::operator<<(poVar14,this->dominions);
    poVar14 = std::operator<<(poVar14," dominions and ");
    poVar14 = (ostream *)std::ostream::operator<<(poVar14,this->tangles);
    std::operator<<(poVar14," tangles.\n");
    poVar14 = std::operator<<((this->super_Solver).logger,"solved in ");
    poVar14 = (ostream *)std::ostream::operator<<(poVar14,this->iterations);
    poVar14 = std::operator<<(poVar14," iterations and ");
    poVar14 = (ostream *)std::ostream::operator<<(poVar14,this->steps);
    std::operator<<(poVar14," pruning steps.\n");
    poVar14 = std::operator<<((this->super_Solver).logger,"odd iterations: ");
    poVar14 = (ostream *)std::ostream::operator<<(poVar14,iVar21);
    std::endl<char,std::char_traits<char>>(poVar14);
    poVar14 = std::operator<<((this->super_Solver).logger,"even iterations: ");
    poVar14 = (ostream *)std::ostream::operator<<(poVar14,iVar16);
    std::endl<char,std::char_traits<char>>(poVar14);
    uVar6 = ((this->super_Solver).game)->n_vertices;
    uVar15 = 0;
    do {
      if ((~((long)uVar6 >> 0x3f) & uVar6) == uVar15) {
        ppiVar2 = (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        for (ppiVar20 = (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                        super__Vector_impl_data._M_start; ppiVar20 != ppiVar2;
            ppiVar20 = ppiVar20 + 1) {
          if (*ppiVar20 != (int *)0x0) {
            operator_delete__(*ppiVar20);
          }
        }
        ppiVar2 = (this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        for (ppiVar20 = (this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                        super__Vector_impl_data._M_start; ppiVar20 != ppiVar2;
            ppiVar20 = ppiVar20 + 1) {
          if (*ppiVar20 != (int *)0x0) {
            operator_delete__(*ppiVar20);
          }
        }
        pvVar3 = this->tin;
        if (pvVar3 != (vector<int,_std::allocator<int>_> *)0x0) {
          piVar4 = pvVar3[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          if (piVar4 != (pointer)0x0) {
            lVar19 = (long)piVar4 * 0x18;
            do {
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                        ((_Vector_base<int,_std::allocator<int>_> *)
                         ((long)&pvVar3[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar19));
              lVar19 = lVar19 + -0x18;
            } while (lVar19 != 0);
          }
          operator_delete__(&pvVar3[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(long)piVar4 * 0x18 + 8);
        }
        if (this->str != (int *)0x0) {
          operator_delete__(this->str);
        }
        if (this->pea_vidx != (uint *)0x0) {
          operator_delete__(this->pea_vidx);
        }
        if (this->Candidates != (int *)0x0) {
          operator_delete__(this->Candidates);
        }
        if (this->dvalue == (int *)0x0) {
          return;
        }
        operator_delete__(this->dvalue);
        return;
      }
      uVar9 = uVar15 >> 6;
      uVar22 = uVar15 & 0x3f;
      uVar15 = uVar15 + 1;
    } while ((((this->super_Solver).disabled)->_bits[uVar9] >> uVar22 & 1) != 0);
    this_01 = (Error *)__cxa_allocate_exception(0x40);
    Error::Error(this_01,"search was incomplete!",
                 "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/dtl.cpp"
                 ,0x47d);
  }
  else {
    iVar16 = 0;
    iVar21 = 0;
    do {
      this->iterations = this->iterations + 1;
      bVar7 = bitset::any(this_00);
      if (!bVar7) {
        iVar21 = 0;
        goto LAB_0016dbf1;
      }
      if ((this->super_Solver).trace != 0) {
        poVar14 = std::operator<<((this->super_Solver).logger,
                                  "\x1b[1;38;5;196miteration\x1b[m \x1b[1;36m");
        poVar14 = (ostream *)std::ostream::operator<<(poVar14,this->iterations + -1);
        std::operator<<(poVar14,"-even\x1b[m\n");
      }
      bVar7 = search(this,0);
      bVar8 = bitset::any(this_00);
      if (!bVar8) goto LAB_0016dbf1;
      if ((this->super_Solver).trace != 0) {
        poVar14 = std::operator<<((this->super_Solver).logger,
                                  "\x1b[1;38;5;196miteration\x1b[m \x1b[1;36m");
        poVar14 = (ostream *)std::ostream::operator<<(poVar14,this->iterations + -1);
        std::operator<<(poVar14,"-odd\x1b[m\n");
      }
      bVar8 = search(this,1);
    } while (bVar7 || bVar8);
    this_01 = (Error *)__cxa_allocate_exception(0x40);
    Error::Error(this_01,"solver stuck",
                 "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/dtl.cpp"
                 ,0x470);
  }
  __cxa_throw(this_01,&Error::typeinfo,Error::~Error);
}

Assistant:

void
DTLSolver::run()
{
    tin = new std::vector<int>[nodecount()];
    str = new int[nodecount()];

    dvalue = new int[nodecount()];

    Z.resize(nodecount());
    S.resize(nodecount());
    W.resize(nodecount());
    G = disabled;
    G.flip();

    Candidates = new int[nodecount()];

    Player.resize(nodecount());
    for (int v=0; v<nodecount(); v++) Player[v] = priority(v)&1;

    Q.resize(nodecount());
    SQ.resize(nodecount());

    Zvec.resize(nodecount());
    tangleto.resize(nodecount());
    escapes.resize(nodecount());

    pea_vS.resize(nodecount());
    pea_iS.resize(nodecount());
    pea_S.resize(nodecount());
    pea_vidx = new unsigned int[nodecount()];
    pea_root.resize(nodecount());

    int even_iterations = 0;
    int odd_iterations = 0;

    if (!interleaved) {
        // First solve for player Odd, then solve for player Even

        while (G.any()) {
            if (trace) logger << "\033[1;38;5;196miteration\033[m \033[1;36m" << iterations << "-even\033[m\n";
            iterations++;
            even_iterations++;
            if (!search(0)) break;
        }

        while (G.any()) {
            if (trace) logger << "\033[1;38;5;196miteration\033[m \033[1;36m" << iterations << "-odd\033[m\n";
            iterations++;
            odd_iterations++;
            if (!search(1)) break;
        }
    } else {
        // Interleave solving for player Even and player Odd

        while (true) {
            iterations++;

            if (!G.any()) break;
            if (trace) logger << "\033[1;38;5;196miteration\033[m \033[1;36m" << iterations-1 << "-even\033[m\n";
            bool found0 = search(0);

            if (!G.any()) break;
            if (trace) logger << "\033[1;38;5;196miteration\033[m \033[1;36m" << iterations-1 << "-odd\033[m\n";
            bool found1 = search(1);

            if (!found0 and !found1) THROW_ERROR("solver stuck");
            
        }
    }

    logger << "found " << dominions << " dominions and "<< tangles << " tangles.\n";
    logger << "solved in " << iterations << " iterations and " << steps << " pruning steps.\n";
    logger << "odd iterations: " << odd_iterations << std::endl;
    logger << "even iterations: " << even_iterations << std::endl;

#ifndef NDEBUG
    // Check if the whole game is now solved
    for (int i=0; i<nodecount(); i++) {
        if (!disabled[i]) { THROW_ERROR("search was incomplete!"); }
    }
#endif

    // Free all explicitly allocated memory
    for (auto &x : tv) delete[] x;
    for (auto &x : tout) delete[] x;
    delete[] tin;
    delete[] str;
    delete[] pea_vidx;
    delete[] Candidates;
    delete[] dvalue;
}